

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

_Bool bson_iter_recurse(bson_iter_t *iter,bson_iter_t *child)

{
  uint8_t uVar1;
  uint32_t uVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  _Bool _Var3;
  uint8_t *puVar4;
  long *extraout_RDX;
  long *extraout_RDX_00;
  char *extraout_RDX_01;
  char *unaff_RBX;
  uint unaff_EBP;
  bson_iter_t *unaff_R14;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_recurse_cold_2();
  }
  else if (child != (bson_iter_t *)0x0) {
    puVar4 = iter->raw;
    uVar1 = puVar4[iter->type];
    if ((byte)(uVar1 - 3) < 2) {
      uVar2 = *(uint32_t *)(puVar4 + iter->d1);
      child->raw = puVar4 + iter->d1;
      child->len = uVar2;
      child->off = 0;
      child->type = 0;
      child->key = 0;
      child->d1 = 0;
      child->d1 = 0;
      child->d2 = 0;
      child->d3 = 0;
      child->d4 = 0;
      child->next_off = 4;
      child->err_off = 0;
    }
    return (byte)(uVar1 - 3) < 2;
  }
  bson_iter_recurse_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_document_cold_3();
LAB_00110793:
    bson_iter_document_cold_2();
  }
  else {
    if ((bson_t *)child == (bson_t *)0x0) goto LAB_00110793;
    if (extraout_RDX != (long *)0x0) {
      *extraout_RDX = 0;
      ((bson_t *)child)->flags = 0;
      if (iter->raw[iter->type] == '\x03') {
        ((bson_t *)child)->flags = *(undefined4 *)(iter->raw + iter->d1);
        *extraout_RDX = (long)(iter->raw + iter->d1);
      }
      return (_Bool)extraout_AL;
    }
  }
  bson_iter_document_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_array_cold_3();
LAB_001107de:
    bson_iter_array_cold_2();
  }
  else {
    if ((bson_t *)child == (bson_t *)0x0) goto LAB_001107de;
    if (extraout_RDX_00 != (long *)0x0) {
      *extraout_RDX_00 = 0;
      ((bson_t *)child)->flags = 0;
      if (iter->raw[iter->type] == '\x04') {
        ((bson_t *)child)->flags = *(undefined4 *)(iter->raw + iter->d1);
        *extraout_RDX_00 = (long)(iter->raw + iter->d1);
      }
      return (_Bool)extraout_AL_00;
    }
  }
  bson_iter_array_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_00110869:
    bson_iter_init_find_cold_2();
LAB_0011086e:
    bson_iter_init_find_cold_1();
  }
  else {
    if ((bson_t *)child == (bson_t *)0x0) goto LAB_00110869;
    unaff_RBX = extraout_RDX_01;
    if (extraout_RDX_01 == (char *)0x0) goto LAB_0011086e;
    unaff_EBP = ((bson_t *)child)->len;
    unaff_R14 = iter;
    if (4 < unaff_EBP) {
      puVar4 = bson_get_data((bson_t *)child);
      iter->raw = puVar4;
      iter->len = ((bson_t *)child)->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_00110838;
    }
  }
  (unaff_R14->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_R14->value).value + 0x10) = 0;
  (unaff_R14->value).value_type = BSON_TYPE_EOD;
  (unaff_R14->value).padding = 0;
  (unaff_R14->value).value.v_int64 = 0;
  unaff_R14->d3 = 0;
  unaff_R14->d4 = 0;
  unaff_R14->next_off = 0;
  unaff_R14->err_off = 0;
  unaff_R14->type = 0;
  unaff_R14->key = 0;
  unaff_R14->d1 = 0;
  unaff_R14->d2 = 0;
  unaff_R14->raw = (uint8_t *)0x0;
  unaff_R14->len = 0;
  unaff_R14->off = 0;
LAB_00110838:
  if (4 < unaff_EBP) {
    _Var3 = _bson_iter_find_with_len(unaff_R14,unaff_RBX,-1);
    return _Var3;
  }
  return false;
}

Assistant:

bool
bson_iter_recurse (const bson_iter_t *iter, /* IN */
                   bson_iter_t *child)      /* OUT */
{
   const uint8_t *data = NULL;
   uint32_t len = 0;

   BSON_ASSERT (iter);
   BSON_ASSERT (child);

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      bson_iter_document (iter, &len, &data);
   } else if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      bson_iter_array (iter, &len, &data);
   } else {
      return false;
   }

   child->raw = data;
   child->len = len;
   child->off = 0;
   child->type = 0;
   child->key = 0;
   child->d1 = 0;
   child->d2 = 0;
   child->d3 = 0;
   child->d4 = 0;
   child->next_off = 4;
   child->err_off = 0;

   return true;
}